

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lazy_geometry_device.cpp
# Opt level: O1

uint embree::createTriangulatedSphere(RTCScene scene,Vec3fa *p,float r)

{
  int iVar1;
  float fVar2;
  uint uVar3;
  undefined8 uVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  int theta;
  int iVar8;
  long lVar9;
  float *pfVar10;
  float *pfVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  float fVar16;
  float fVar17;
  float __x;
  float __x_00;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  float phif;
  
  uVar4 = rtcNewGeometry(g_device,0);
  lVar5 = rtcSetNewGeometryBuffer(uVar4,1,0,0x9003,0x10,0x348);
  lVar6 = rtcSetNewGeometryBuffer(uVar4,0,0,0x5003,0xc,0x5f0);
  auVar18._0_12_ = ZEXT812(0x42200000);
  auVar18._12_4_ = 0;
  auVar18 = rcpss(auVar18,ZEXT816(0x42200000));
  auVar19._0_12_ = ZEXT812(0x41a00000);
  auVar19._12_4_ = 0;
  auVar19 = rcpss(auVar19,ZEXT816(0x41a00000));
  pfVar10 = (float *)(lVar5 + 8);
  iVar8 = 0;
  lVar5 = 0;
  iVar14 = 0;
  do {
    iVar15 = (int)lVar5;
    __x = (float)iVar15 * 3.1415927 * (2.0 - auVar19._0_4_ * 20.0) * auVar19._0_4_;
    lVar9 = 0;
    pfVar11 = pfVar10;
    do {
      __x_00 = ((float)(int)lVar9 + (float)(int)lVar9) * 3.1415927 *
               (2.0 - auVar18._0_4_ * 40.0) * auVar18._0_4_;
      fVar2 = (p->field_0).m128[0];
      fVar16 = sinf(__x);
      fVar17 = sinf(__x_00);
      pfVar11[-2] = fVar17 * fVar16 * r + fVar2;
      fVar2 = (p->field_0).m128[1];
      fVar16 = cosf(__x);
      pfVar11[-1] = fVar16 * r + fVar2;
      fVar2 = (p->field_0).m128[2];
      fVar16 = sinf(__x);
      fVar17 = cosf(__x_00);
      *pfVar11 = fVar17 * fVar16 * r + fVar2;
      lVar9 = lVar9 + 1;
      pfVar11 = pfVar11 + 4;
    } while (lVar9 != 0x28);
    if (lVar5 != 0) {
      iVar7 = -0x28;
      do {
        iVar12 = iVar7 + 0x29;
        if (iVar7 == -1) {
          iVar12 = 0;
        }
        iVar1 = iVar12 + iVar15 * 0x28 + -0x28;
        iVar13 = iVar8 + iVar7 + 0x28;
        if (lVar5 != 1) {
          lVar9 = (long)iVar14;
          *(int *)(lVar6 + lVar9 * 0xc) = iVar13;
          *(int *)(lVar6 + 4 + lVar9 * 0xc) = iVar1;
          *(int *)(lVar6 + 8 + lVar9 * 0xc) = iVar8 + iVar7;
          iVar14 = iVar14 + 1;
        }
        if (lVar5 != 0x14) {
          lVar9 = (long)iVar14;
          *(int *)(lVar6 + lVar9 * 0xc) = iVar12 + iVar15 * 0x28;
          *(int *)(lVar6 + 4 + lVar9 * 0xc) = iVar1;
          *(int *)(lVar6 + 8 + lVar9 * 0xc) = iVar13;
          iVar14 = iVar14 + 1;
        }
        iVar7 = iVar7 + 1;
      } while (iVar7 != 0);
    }
    lVar5 = lVar5 + 1;
    pfVar10 = pfVar10 + 0xa0;
    iVar8 = iVar8 + 0x28;
  } while (lVar5 != 0x15);
  rtcCommitGeometry(uVar4);
  uVar3 = rtcAttachGeometry(scene,uVar4);
  rtcReleaseGeometry(uVar4);
  return uVar3;
}

Assistant:

unsigned int createTriangulatedSphere (RTCScene scene, const Vec3fa& p, float r)
{
  /* create triangle mesh */
  RTCGeometry geom = rtcNewGeometry (g_device, RTC_GEOMETRY_TYPE_TRIANGLE);

  /* map triangle and vertex buffers */
  Vertex* vertices = (Vertex*) rtcSetNewGeometryBuffer(geom, RTC_BUFFER_TYPE_VERTEX, 0, RTC_FORMAT_FLOAT3, sizeof(Vertex), numTheta*(numPhi+1));
  Triangle* triangles = (Triangle*) rtcSetNewGeometryBuffer(geom, RTC_BUFFER_TYPE_INDEX, 0, RTC_FORMAT_UINT3, sizeof(Triangle), 2*numTheta*(numPhi-1));

  /* create sphere */
  int tri = 0;
  const float rcpNumTheta = rcp((float)numTheta);
  const float rcpNumPhi   = rcp((float)numPhi);
  for (int phi=0; phi<=numPhi; phi++)
  {
    for (int theta=0; theta<numTheta; theta++)
    {
      const float phif   = phi*float(pi)*rcpNumPhi;
      const float thetaf = theta*2.0f*float(pi)*rcpNumTheta;

      Vertex& v = vertices[phi*numTheta+theta];
      v.x = p.x + r*sin(phif)*sin(thetaf);
      v.y = p.y + r*cos(phif);
      v.z = p.z + r*sin(phif)*cos(thetaf);
    }
    if (phi == 0) continue;

    for (int theta=1; theta<=numTheta; theta++)
    {
      int p00 = (phi-1)*numTheta+theta-1;
      int p01 = (phi-1)*numTheta+theta%numTheta;
      int p10 = phi*numTheta+theta-1;
      int p11 = phi*numTheta+theta%numTheta;

      if (phi > 1) {
        triangles[tri].v0 = p10;
        triangles[tri].v1 = p01;
        triangles[tri].v2 = p00;
        tri++;
      }

      if (phi < numPhi) {
        triangles[tri].v0 = p11;
        triangles[tri].v1 = p01;
        triangles[tri].v2 = p10;
        tri++;
      }
    }
  }

  rtcCommitGeometry(geom);
  unsigned int geomID = rtcAttachGeometry(scene,geom);
  rtcReleaseGeometry(geom);
  return geomID;
}